

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

pos_t check_line_directive_args(c2m_ctx_t c2m_ctx,VARR_token_t *buffer)

{
  char cVar1;
  undefined1 uVar2;
  short sVar3;
  token_t *pptVar4;
  token_t ptVar5;
  undefined8 *puVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  int *piVar12;
  ulong uVar13;
  c2m_ctx_t extraout_RAX;
  c2m_ctx_t pcVar14;
  c2m_ctx_t pcVar15;
  node_t pnVar16;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  char *extraout_RAX_02;
  c2m_ctx_t extraout_RAX_03;
  undefined4 *puVar17;
  c2m_ctx_t pcVar18;
  ulong uVar19;
  ulong uVar20;
  MIR_context_t pMVar21;
  char *pcVar22;
  ulong uVar23;
  size_t extraout_RDX;
  size_t sVar24;
  size_t extraout_RDX_00;
  ulong *extraout_RDX_01;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar25;
  c2m_ctx_t extraout_RDX_10;
  c2m_ctx_t extraout_RDX_11;
  c2m_ctx_t extraout_RDX_12;
  c2m_ctx_t pcVar26;
  anon_union_8_2_027a474d_for_u aVar27;
  c2m_ctx_t unaff_RBX;
  VARR_char *unaff_RBP;
  c2mir_options *pcVar28;
  node_t_conflict pnVar29;
  c2m_ctx_t pcVar30;
  c2m_ctx_t unaff_R13;
  short *unaff_R14;
  c2m_ctx_t unaff_R15;
  char *pcVar31;
  char *pcVar32;
  bool bVar33;
  pos_t pVar34;
  pos_t pVar35;
  pos_t pVar36;
  pos_t pVar37;
  pos_t pVar38;
  pos_t pVar39;
  val vVar40;
  pos_t pVar41;
  pos_t pVar42;
  val vStack_188;
  val vStack_178;
  c2m_ctx_t pcStack_168;
  c2m_ctx_t pcStack_160;
  c2m_ctx_t pcStack_158;
  short *psStack_150;
  c2m_ctx_t pcStack_148;
  c2m_ctx_t pcStack_138;
  c2m_ctx_t pcStack_130;
  pre_ctx *ppStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  macro_t pmStack_110;
  macro mStack_108;
  c2m_ctx_t pcStack_e8;
  c2m_ctx_t pcStack_e0;
  c2m_ctx_t pcStack_d8;
  short *psStack_d0;
  c2m_ctx_t pcStack_c8;
  VARR_char *pVStack_c0;
  c2m_ctx_t pcStack_b0;
  c2m_ctx_t pcStack_a8;
  c2m_ctx_t pcStack_a0;
  short *psStack_98;
  c2m_ctx_t pcStack_90;
  VARR_char *pVStack_88;
  c2m_ctx_t pcStack_80;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_09;
  
  if (buffer != (VARR_token_t *)0x0) {
    uVar20 = buffer->els_num;
    if (uVar20 != 0) {
      pptVar4 = buffer->varr;
      sVar3 = *(short *)*pptVar4;
      uVar19 = (ulong)(sVar3 == 0x20);
      if ((uVar19 < uVar20) && (ptVar5 = pptVar4[uVar19], *(short *)ptVar5 == 0x100)) {
        pcVar22 = (ptVar5->pos).fname;
        pcVar32 = ptVar5->repr;
        pcVar11 = pcVar32;
        do {
          cVar1 = *pcVar11;
          pcVar11 = pcVar11 + 1;
        } while ((byte)(cVar1 - 0x30U) < 10);
        if (cVar1 == '\0') {
          piVar12 = __errno_location();
          *piVar12 = 0;
          uVar13 = strtoll(pcVar32,(char **)0x0,10);
          if ((*piVar12 != 0) || (uVar13 >> 0x1f != 0)) {
            ptVar5 = pptVar4[uVar19];
            uVar25._0_4_ = (ptVar5->pos).lno;
            uVar25._4_4_ = (ptVar5->pos).ln_pos;
            error(c2m_ctx,0x1c18ce,(ptVar5->pos).fname,uVar25,ptVar5->repr);
          }
          uVar19 = (ulong)(sVar3 == 0x20) + 1;
          if (uVar19 < uVar20) {
            uVar19 = uVar19 + (*(short *)pptVar4[uVar19] == 0x20);
          }
          if ((uVar19 < uVar20) && (pptVar4 = pptVar4 + uVar19, *(short *)*pptVar4 == 0x102)) {
            uVar19 = uVar19 + 1;
            pcVar22 = ((*pptVar4)->node->u).s.s;
          }
          pcVar32 = (char *)0x0;
          if (uVar19 == uVar20) {
            pcVar32 = pcVar22;
          }
          uVar23 = 0xffffffffffffffff;
          if (uVar19 == uVar20) {
            uVar23 = uVar13 & 0xffffffff;
          }
          goto LAB_00192d39;
        }
      }
    }
    pcVar32 = (char *)0x0;
    uVar23 = 0xffffffffffffffff;
LAB_00192d39:
    pVar41.lno = (int)uVar23;
    pVar41.ln_pos = (int)(uVar23 >> 0x20);
    pVar41.fname = pcVar32;
    return pVar41;
  }
  check_line_directive_args_cold_1();
  pcVar30 = (c2m_ctx_t)c2m_ctx->temp_string;
  pcVar18 = c2m_ctx;
  pcVar14 = unaff_R15;
  pcStack_80 = extraout_RAX;
  if (pcVar30 == (c2m_ctx_t)0x0) {
LAB_00192f2e:
    pVStack_88 = (VARR_char *)0x192f33;
    add_to_temp_string_cold_4();
LAB_00192f33:
    pVStack_88 = (VARR_char *)0x192f38;
    add_to_temp_string_cold_3();
  }
  else {
    unaff_R13 = (c2m_ctx_t)pcVar30->ctx;
    unaff_RBX = c2m_ctx;
    if (unaff_R13 == (c2m_ctx_t)0x0) {
      unaff_R13 = (c2m_ctx_t)0x0;
LAB_00192e52:
      pVStack_88 = (VARR_char *)0x192e5e;
      pcVar18 = (c2m_ctx_t)buffer;
      pcStack_80 = (c2m_ctx_t)buffer;
      pcVar14 = (c2m_ctx_t)strlen((char *)buffer);
      sVar24 = extraout_RDX;
      if (pcVar14 != (c2m_ctx_t)0x0) {
        unaff_R13 = (c2m_ctx_t)0x0;
        buffer = (VARR_token_t *)pcStack_80;
        do {
          unaff_RBP = c2m_ctx->temp_string;
          pcVar15 = (c2m_ctx_t)unaff_RBP->varr;
          if (pcVar15 == (c2m_ctx_t)0x0) {
            pVStack_88 = (VARR_char *)0x192f2e;
            add_to_temp_string_cold_2();
            goto LAB_00192f2e;
          }
          sVar24 = unaff_RBP->els_num;
          uVar2 = *(undefined1 *)
                   ((long)unaff_R13->env[0].__saved_mask.__val +
                   (long)(((c2m_ctx_t)buffer)->env + -1) + 0x60);
          unaff_R14 = (short *)CONCAT71((int7)((ulong)unaff_R14 >> 8),uVar2);
          uVar20 = sVar24 + 1;
          if (unaff_RBP->size < uVar20) {
            pcVar30 = (c2m_ctx_t)((uVar20 >> 1) + uVar20);
            pVStack_88 = (VARR_char *)0x192ea7;
            pcVar18 = pcVar15;
            pcVar15 = (c2m_ctx_t)realloc(pcVar15,(size_t)pcVar30);
            unaff_RBP->varr = (char *)pcVar15;
            unaff_RBP->size = (size_t)pcVar30;
            sVar24 = unaff_RBP->els_num;
            uVar20 = sVar24 + 1;
            buffer = (VARR_token_t *)pcStack_80;
          }
          unaff_R13 = (c2m_ctx_t)((long)&unaff_R13->ctx + 1);
          unaff_RBP->els_num = uVar20;
          *(undefined1 *)((long)pcVar15->env[0].__jmpbuf + (sVar24 - 0x10)) = uVar2;
        } while (pcVar14 != unaff_R13);
        pcVar30 = (c2m_ctx_t)c2m_ctx->temp_string;
        unaff_R13 = (c2m_ctx_t)pcVar30->ctx;
        unaff_R15 = pcVar14;
      }
      pnVar16 = (node_t)pcVar30->env[0].__jmpbuf[0];
      pcVar14 = unaff_R15;
      if (pnVar16 != (node_t)0x0) {
        pMVar21 = (MIR_context_t)((long)&unaff_R13->ctx + 1);
        if ((MIR_context_t)pcVar30->options < pMVar21) {
          pcVar28 = (c2mir_options *)((long)&pMVar21->gen_ctx + ((ulong)pMVar21 >> 1));
          pVStack_88 = (VARR_char *)0x192eff;
          pnVar16 = (node_t)realloc(pnVar16,(size_t)pcVar28);
          pcVar30->env[0].__jmpbuf[0] = (long)pnVar16;
          pcVar30->options = pcVar28;
          unaff_R13 = (c2m_ctx_t)pcVar30->ctx;
          pMVar21 = (MIR_context_t)((long)&unaff_R13->ctx + 1);
          sVar24 = extraout_RDX_00;
        }
        pcVar30->ctx = pMVar21;
        *(undefined1 *)((long)unaff_R13->env[0].__jmpbuf + (long)&pnVar16[-1].u) = 0;
        pVar34.lno = (int)sVar24;
        pVar34.ln_pos = (int)(sVar24 >> 0x20);
        pVar34.fname = (char *)pnVar16;
        return pVar34;
      }
      goto LAB_00192f33;
    }
    pnVar16 = (node_t)pcVar30->env[0].__jmpbuf[0];
    if (pnVar16 != (node_t)0x0) {
      pcVar18 = (c2m_ctx_t)((long)&unaff_R13[-1].gen_ctx + 7);
      if (*(char *)((long)pcVar18->env[0].__jmpbuf + (long)&pnVar16[-1].u) == '\0') {
        pcVar30->ctx = (MIR_context_t)pcVar18;
        unaff_R13 = pcVar18;
      }
      goto LAB_00192e52;
    }
  }
  pVStack_88 = (VARR_char *)check_pragma;
  add_to_temp_string_cold_1();
  pcStack_b0 = unaff_RBX;
  pcStack_a8 = pcVar30;
  pcStack_a0 = unaff_R13;
  psStack_98 = unaff_R14;
  pcStack_90 = pcVar14;
  pVStack_88 = unaff_RBP;
  if (extraout_RDX_01 != (ulong *)0x0) {
    pcVar22 = (char *)*extraout_RDX_01;
    puVar6 = (undefined8 *)extraout_RDX_01[2];
    if (pcVar22 == (char *)0x0) {
      pcVar32 = (char *)0x0;
    }
    else {
      pcVar32 = (char *)(ulong)(*(short *)*puVar6 == 0x20);
    }
    if ((pcVar22 <= pcVar32) || (*(short *)puVar6[(long)pcVar32] != 0x103)) {
LAB_00192f9c:
      warning(pcVar18,0x1c18f0,(char *)((c2m_ctx_t)buffer)->options,
              (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0]);
      pVar35.lno = (int)extraout_RDX_02;
      pVar35.ln_pos = (int)((ulong)extraout_RDX_02 >> 0x20);
      pVar35.fname = extraout_RAX_00;
      return pVar35;
    }
    pVStack_c0 = (VARR_char *)0x192f98;
    iVar8 = strcmp(*(char **)((short *)puVar6[(long)pcVar32] + 0x14),"STDC");
    if (iVar8 != 0) goto LAB_00192f9c;
    pcVar11 = pcVar32 + 1;
    if ((pcVar11 < pcVar22) && (*(short *)puVar6[(long)(pcVar32 + 1)] == 0x20)) {
      pcVar11 = (char *)((ulong)pcVar32 | 2);
    }
    if ((pcVar11 < pcVar22) && (*(short *)puVar6[(long)pcVar11] == 0x103)) {
      pcVar32 = *(char **)((short *)puVar6[(long)pcVar11] + 0x14);
      pVStack_c0 = (VARR_char *)0x193001;
      iVar8 = strcmp(pcVar32,"FP_CONTRACT");
      uVar25 = extraout_RDX_03;
      if (iVar8 != 0) {
        pVStack_c0 = (VARR_char *)0x193014;
        iVar8 = strcmp(pcVar32,"FENV_ACCESS");
        uVar25 = extraout_RDX_04;
        if (iVar8 != 0) {
          pVStack_c0 = (VARR_char *)0x193027;
          iVar8 = strcmp(pcVar32,"CX_LIMITED_RANGE");
          uVar25 = extraout_RDX_05;
          if (iVar8 != 0) {
            pcVar28 = ((c2m_ctx_t)buffer)->options;
            pnVar16 = (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0];
            pcVar22 = "unknown STDC pragma %s";
            goto LAB_001930e8;
          }
        }
      }
      pcVar31 = pcVar11 + 1;
      if ((pcVar31 < pcVar22) && (*(short *)puVar6[(long)(pcVar11 + 1)] == 0x20)) {
        pcVar31 = pcVar11 + 2;
      }
      if ((pcVar31 < pcVar22) && (*(short *)puVar6[(long)pcVar31] == 0x103)) {
        pcVar32 = *(char **)((short *)puVar6[(long)pcVar31] + 0x14);
        if (((*pcVar32 != 'O') || (pcVar32[1] != 'N')) || (pcVar32[2] != '\0')) {
          pVStack_c0 = (VARR_char *)0x1930bc;
          iVar8 = strcmp(pcVar32,"OFF");
          uVar25 = extraout_RDX_07;
          if (iVar8 != 0) {
            pVStack_c0 = (VARR_char *)0x1930cf;
            iVar8 = strcmp(pcVar32,"DEFAULT");
            uVar25 = extraout_RDX_08;
            if (iVar8 != 0) {
              pcVar28 = ((c2m_ctx_t)buffer)->options;
              pnVar16 = (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0];
              pcVar22 = "unknown STDC pragma value";
LAB_001930e8:
              error(pcVar18,pcVar22,(char *)pcVar28,pnVar16,pcVar32);
              pVar37.lno = (int)extraout_RDX_09;
              pVar37.ln_pos = (int)((ulong)extraout_RDX_09 >> 0x20);
              pVar37.fname = extraout_RAX_02;
              return pVar37;
            }
          }
        }
        pcVar32 = pcVar31 + 1;
        if ((pcVar32 < pcVar22) &&
           ((*(short *)puVar6[(long)(pcVar31 + 1)] == 0x20 ||
            (*(short *)puVar6[(long)(pcVar31 + 1)] == 10)))) {
          pcVar32 = pcVar31 + 2;
        }
        if (pcVar22 <= pcVar32) {
          pVar38.lno = (int)uVar25;
          pVar38.ln_pos = (int)((ulong)uVar25 >> 0x20);
          pVar38.fname = pcVar32;
          return pVar38;
        }
        pcVar28 = ((c2m_ctx_t)buffer)->options;
        pnVar16 = (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0];
        pcVar22 = "garbage at STDC pragma end";
      }
      else {
        pcVar28 = ((c2m_ctx_t)buffer)->options;
        pnVar16 = (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0];
        pcVar22 = "wrong STDC pragma value";
      }
    }
    else {
      pcVar28 = ((c2m_ctx_t)buffer)->options;
      pnVar16 = (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0];
      pcVar22 = "wrong STDC pragma";
    }
    error(pcVar18,pcVar22,(char *)pcVar28,pnVar16);
    pVar36.lno = (int)extraout_RDX_06;
    pVar36.ln_pos = (int)((ulong)extraout_RDX_06 >> 0x20);
    pVar36.fname = extraout_RAX_01;
    return pVar36;
  }
  pVStack_c0 = (VARR_char *)replace_defined;
  check_pragma_cold_1();
  pcVar22 = (char *)buffer;
  pcStack_130 = pcVar18;
  pcStack_e8 = unaff_RBX;
  pcStack_e0 = pcVar30;
  pcStack_d8 = unaff_R13;
  psStack_d0 = unaff_R14;
  pcStack_c8 = pcVar14;
  pVStack_c0 = unaff_RBP;
  if ((c2m_ctx_t)buffer != (c2m_ctx_t)0x0) {
    pcVar30 = (c2m_ctx_t)((c2m_ctx_t)buffer)->ctx;
    pcVar15 = extraout_RAX_03;
    pcVar26 = extraout_RDX_10;
    if (pcVar30 != (c2m_ctx_t)0x0) {
      iVar8 = 0;
      ppStack_128 = pcVar18->pre_ctx;
      pcVar14 = (c2m_ctx_t)&DAT_00000001;
      do {
        pnVar16 = (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0];
        if (pnVar16 == (node_t)0x0) {
          pcStack_148 = (c2m_ctx_t)0x1933e6;
          replace_defined_cold_3();
          unaff_R13 = (c2m_ctx_t)0x0;
LAB_001933e6:
          pcStack_148 = (c2m_ctx_t)0x1933eb;
          replace_defined_cold_2();
          unaff_RBX = (c2m_ctx_t)buffer;
          goto LAB_001933eb;
        }
        unaff_R14 = (short *)(&pnVar16[1].attr)[(long)&pcVar14[-1].gen_ctx];
        unaff_R13 = pcVar18;
        if (*unaff_R14 == 0x103) {
          unaff_R13 = *(c2m_ctx_t *)(unaff_R14 + 0x14);
          pcVar22 = "defined";
          pcStack_148 = (c2m_ctx_t)0x1931d2;
          iVar9 = strcmp((char *)unaff_R13,"defined");
          pcVar26 = extraout_RDX_11;
          if (iVar9 == 0) {
            pcVar26 = pcVar14;
            if ((pcVar14 < pcVar30) && (**(short **)(&pnVar16->code + (long)pcVar14 * 2) == 0x20)) {
              pcVar26 = (c2m_ctx_t)((long)&pcVar14->ctx + 1);
            }
            if (pcVar26 < pcVar30) {
              unaff_R13 = (c2m_ctx_t)((long)&pcVar14[-1].gen_ctx + 7);
              sVar3 = *(short *)*(token_t *)(&pnVar16->code + (long)pcVar26 * 2);
              if (sVar3 == 0x28) {
                pcVar18 = (c2m_ctx_t)((long)&pcVar26->ctx + 1);
                if ((pcVar18 < pcVar30) && (*(&pnVar16->attr)[(long)&pcVar26->ctx] == 0x20)) {
                  pcVar18 = (c2m_ctx_t)((long)&pcVar26->ctx + 2);
                  pcVar26 = pcVar18;
                }
                if ((pcVar18 < pcVar30) &&
                   (*(short *)*(token_t *)(&pnVar16->code + (long)pcVar18 * 2) == 0x103)) {
                  pcVar22 = (char *)((long)&pcVar18->ctx + 1);
                  if ((pcVar22 < pcVar30) &&
                     (pcVar26 = (c2m_ctx_t)(&pnVar16->attr)[(long)&pcVar18->ctx],
                     *(undefined2 *)&pcVar26->ctx == N_OR)) {
                    pcVar22 = (char *)((long)&pcVar18->ctx + 2);
                  }
                  if ((pcVar22 < pcVar30) &&
                     (**(short **)(&pnVar16->code + (long)pcVar22 * 2) == 0x29)) {
                    pcStack_148 = (c2m_ctx_t)0x193358;
                    pcStack_138 = (c2m_ctx_t)pcVar22;
                    mStack_108.id = *(token_t *)(&pnVar16->code + (long)pcVar18 * 2);
                    iVar9 = HTAB_macro_t_do(ppStack_128->macro_tab,&mStack_108,HTAB_FIND,
                                            &pmStack_110);
                    pcVar30 = (c2m_ctx_t)0x1b530d;
                    if (iVar9 != 0) {
                      pcVar30 = (c2m_ctx_t)0x1b3967;
                    }
                    uStack_120 = *(undefined8 *)(unaff_R14 + 4);
                    uStack_118 = *(undefined8 *)(unaff_R14 + 8);
                    pcVar22 = (char *)0x30;
                    pcStack_148 = (c2m_ctx_t)0x193385;
                    pcVar18 = pcStack_130;
                    puVar17 = (undefined4 *)reg_malloc(pcStack_130,0x30);
                    *puVar17 = 0x100;
                    *(undefined8 *)(puVar17 + 2) = uStack_120;
                    *(undefined8 *)(puVar17 + 4) = uStack_118;
                    *(c2m_ctx_t *)(puVar17 + 10) = pcVar30;
                    puVar17[6] = 0;
                    *(undefined8 *)(puVar17 + 8) = 0;
                    pnVar16 = (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0];
                    if ((pnVar16 != (node_t)0x0) &&
                       (unaff_R13 < (c2m_ctx_t)((c2m_ctx_t)buffer)->ctx)) goto LAB_001932ae;
                    goto LAB_001933f0;
                  }
                }
              }
              else if (sVar3 == 0x103) {
                pcStack_148 = (c2m_ctx_t)0x193247;
                pcStack_138 = pcVar26;
                mStack_108.id = *(token_t *)(&pnVar16->code + (long)pcVar26 * 2);
                iVar9 = HTAB_macro_t_do(ppStack_128->macro_tab,&mStack_108,HTAB_FIND,&pmStack_110);
                pcVar30 = (c2m_ctx_t)0x1b530d;
                if (iVar9 != 0) {
                  pcVar30 = (c2m_ctx_t)0x1b3967;
                }
                uStack_120 = *(undefined8 *)(unaff_R14 + 4);
                uStack_118 = *(undefined8 *)(unaff_R14 + 8);
                pcVar22 = (char *)0x30;
                pcStack_148 = (c2m_ctx_t)0x193274;
                pcVar18 = pcStack_130;
                puVar17 = (undefined4 *)reg_malloc(pcStack_130,0x30);
                *puVar17 = 0x100;
                *(undefined8 *)(puVar17 + 2) = uStack_120;
                *(undefined8 *)(puVar17 + 4) = uStack_118;
                *(c2m_ctx_t *)(puVar17 + 10) = pcVar30;
                puVar17[6] = 0;
                *(undefined8 *)(puVar17 + 8) = 0;
                pnVar16 = (node_t)((c2m_ctx_t)buffer)->env[0].__jmpbuf[0];
                if ((pnVar16 == (node_t)0x0) || ((c2m_ctx_t)((c2m_ctx_t)buffer)->ctx <= unaff_R13))
                goto LAB_001933e6;
LAB_001932ae:
                *(undefined4 **)((long)pnVar16 + (long)pcVar14 * 8 + -8) = puVar17;
                pcVar22 = (char *)((ulong)pcVar14 & 0xffffffff);
                pcStack_148 = (c2m_ctx_t)0x1932c5;
                unaff_R13 = (c2m_ctx_t)buffer;
                del_tokens(buffer,(int)pcVar14,(int)pcStack_138 + iVar8);
                pcVar26 = extraout_RDX_12;
              }
            }
          }
        }
        pcVar30 = (c2m_ctx_t)((c2m_ctx_t)buffer)->ctx;
        iVar8 = iVar8 + -1;
        pcVar15 = (c2m_ctx_t)((long)&pcVar14->ctx + 1);
        bVar33 = pcVar14 < pcVar30;
        pcVar18 = unaff_R13;
        pcVar14 = pcVar15;
      } while (bVar33);
    }
    pVar39._8_8_ = pcVar26;
    pVar39.fname = (char *)pcVar15;
    return pVar39;
  }
LAB_001933eb:
  pcStack_148 = (c2m_ctx_t)0x1933f0;
  replace_defined_cold_4();
  buffer = (VARR_token_t *)unaff_RBX;
LAB_001933f0:
  pcStack_148 = (c2m_ctx_t)eval;
  replace_defined_cold_1();
  pcStack_168 = (c2m_ctx_t)buffer;
  pcStack_160 = pcVar30;
  pcStack_158 = unaff_R13;
  psStack_150 = unaff_R14;
  pcStack_148 = pcVar14;
  switch(*(node_code_t *)&((c2m_ctx_t)pcVar22)->ctx) {
  case N_IGNORE:
    pVar41 = get_node_pos((c2m_ctx_t)pcVar18->node_positions,
                          (node_t_conflict)(ulong)*(uint *)((long)&((c2m_ctx_t)pcVar22)->ctx + 4));
    error(pcVar18,0x1c15f3,pVar41.fname,pVar41._8_8_);
    goto LAB_001936aa;
  case N_I:
  case N_L:
  case N_LL:
    aVar27.i_val = ((anon_union_8_2_027a474d_for_u *)(((c2m_ctx_t)pcVar22)->env[0].__jmpbuf + 2))->
                   i_val;
    goto LAB_001938ee;
  case N_U:
  case N_UL:
  case N_ULL:
  case N_CH16:
  case N_CH32:
    pcVar32 = &DAT_00000001;
    aVar27.i_val = ((anon_union_8_2_027a474d_for_u *)(((c2m_ctx_t)pcVar22)->env[0].__jmpbuf + 2))->
                   i_val;
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
  case N_CH:
    aVar27 = (anon_union_8_2_027a474d_for_u)
             (long)*(char *)(((c2m_ctx_t)pcVar22)->env[0].__jmpbuf + 2);
    goto LAB_001938ee;
  case N_ANDAND:
  case N_OROR:
    vVar40 = eval(pcVar18,(node_t_conflict)((c2m_ctx_t)pcVar22)->env[0].__jmpbuf[2]);
    if (*(node_code_t *)&((c2m_ctx_t)pcVar22)->ctx != N_ANDAND) {
      if (vVar40.u.i_val == 0) goto LAB_0019373e;
      aVar27.i_val = 1;
      goto LAB_001938ee;
    }
    if (vVar40.u.i_val != 0) {
LAB_0019373e:
      lVar7 = ((c2m_ctx_t)pcVar22)->env[0].__jmpbuf[2];
      pcVar32 = (char *)0x0;
      if (lVar7 == 0) {
        pnVar29 = (node_t_conflict)0x0;
      }
      else {
        pnVar29 = *(node_t_conflict *)(lVar7 + 0x18);
      }
      vVar40 = eval(pcVar18,pnVar29);
      bVar33 = vVar40.u.i_val == 0;
      goto LAB_001938e4;
    }
LAB_001936aa:
    pcVar32 = (char *)0x0;
    aVar27.i_val = 0;
    break;
  case N_EQ:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    bVar33 = vStack_188.u.i_val == CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_);
    goto LAB_0019353a;
  case N_NE:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    bVar33 = vStack_188.u.i_val == CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_);
LAB_001938e4:
    aVar27.i_val._1_7_ = 0;
    aVar27.i_val._0_1_ = !bVar33;
    break;
  case N_LT:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    if (uVar10 != 0) {
      aVar27.i_val._1_7_ = 0;
      aVar27.i_val._0_1_ =
           vStack_188.u.u_val < CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_);
      break;
    }
    aVar27.i_val._1_7_ = 0;
    aVar27.i_val._0_1_ =
         vStack_188.u.i_val < (long)CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_);
    goto LAB_001938ee;
  case N_LE:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    if (uVar10 != 0) {
      aVar27.i_val._1_7_ = 0;
      aVar27.i_val._0_1_ =
           vStack_188.u.u_val <= CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_);
      break;
    }
    aVar27.i_val._1_7_ = 0;
    aVar27.i_val._0_1_ =
         vStack_188.u.i_val <= (long)CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_);
    goto LAB_001938ee;
  case N_GT:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    if (uVar10 != 0) {
      aVar27.i_val._1_7_ = 0;
      aVar27.i_val._0_1_ =
           CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) < vStack_188.u.u_val;
      break;
    }
    aVar27.i_val._1_7_ = 0;
    aVar27.i_val._0_1_ =
         (long)CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) < vStack_188.u.i_val;
    goto LAB_001938ee;
  case N_GE:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    if (uVar10 != 0) {
      aVar27.i_val._1_7_ = 0;
      aVar27.i_val._0_1_ =
           CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) <= vStack_188.u.u_val;
      break;
    }
    aVar27.i_val._1_7_ = 0;
    aVar27.i_val._0_1_ =
         (long)CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) <= vStack_188.u.i_val;
    goto LAB_001938ee;
  case N_BITWISE_NOT:
    vVar40 = eval(pcVar18,(node_t_conflict)((c2m_ctx_t)pcVar22)->env[0].__jmpbuf[2]);
    pcVar32 = (char *)(ulong)(uint)vVar40.uns_p;
    aVar27.u_val = ~vVar40.u.u_val;
    break;
  case N_NOT:
    vVar40 = eval(pcVar18,(node_t_conflict)((c2m_ctx_t)pcVar22)->env[0].__jmpbuf[2]);
    uVar10 = vVar40.uns_p;
    bVar33 = vVar40.u.i_val == 0;
LAB_0019353a:
    pcVar32 = (char *)(ulong)uVar10;
    aVar27.i_val._1_7_ = 0;
    aVar27.i_val._0_1_ = bVar33;
    break;
  case N_AND:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    aVar27.u_val = CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) & vStack_188.u.u_val;
    break;
  case N_OR:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    aVar27.u_val = CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) | vStack_188.u.u_val;
    break;
  case N_XOR:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    aVar27.u_val = CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) ^ vStack_188.u.u_val;
    break;
  case N_LSH:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    aVar27.u_val = vStack_188.u.u_val << ((ulong)(byte)vStack_178.u.u_val._0_1_ & 0x3f);
    break;
  case N_RSH:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    if (uVar10 != 0) {
      aVar27.u_val = vStack_188.u.u_val >> ((ulong)(byte)vStack_178.u.u_val._0_1_ & 0x3f);
      break;
    }
    aVar27.i_val = vStack_188.u.i_val >> ((ulong)(byte)vStack_178.u.u_val._0_1_ & 0x3f);
LAB_001938ee:
    pcVar32 = (char *)0x0;
    break;
  case N_ADD:
    pnVar29 = (node_t_conflict)((c2m_ctx_t)pcVar22)->env[0].__jmpbuf[2];
    if ((pnVar29 != (node_t_conflict)0x0) && ((pnVar29->op_link).next != (node_t)0x0)) {
      uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
      pcVar32 = (char *)(ulong)uVar10;
      aVar27.i_val = CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) +
                     vStack_188.u.i_val;
      break;
    }
    goto LAB_001938c6;
  case N_SUB:
    pnVar29 = (node_t_conflict)((c2m_ctx_t)pcVar22)->env[0].__jmpbuf[2];
    if ((pnVar29 == (node_t_conflict)0x0) || ((pnVar29->op_link).next == (node_t)0x0)) {
      vVar40 = eval(pcVar18,pnVar29);
      pcVar32 = (char *)(ulong)(uint)vVar40.uns_p;
      aVar27.i_val = -vVar40.u.i_val;
    }
    else {
      uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
      pcVar32 = (char *)(ulong)uVar10;
      aVar27.i_val = vStack_188.u.i_val -
                     CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_);
    }
    break;
  case N_MUL:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    pcVar32 = (char *)(ulong)uVar10;
    aVar27.i_val = CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_) * vStack_188.u.i_val;
    break;
  case N_DIV:
  case N_MOD:
    uVar10 = eval_binop_operands(pcVar18,(node_t_conflict)pcVar22,&vStack_188,&vStack_178);
    uVar20 = CONCAT71(vStack_178.u.i_val._1_7_,vStack_178.u.i_val._0_1_);
    pcVar32 = (char *)(ulong)uVar10;
    if (uVar10 == 0) {
      if (uVar20 != 0) {
        aVar27.i_val = vStack_188.u.i_val % (long)uVar20;
        if (*(node_code_t *)&((c2m_ctx_t)pcVar22)->ctx == N_DIV) {
          aVar27.i_val = vStack_188.u.i_val / (long)uVar20;
        }
        goto LAB_001938ee;
      }
    }
    else if (uVar20 != 0) {
      aVar27.u_val = vStack_188.u.u_val % uVar20;
      if (*(node_code_t *)&((c2m_ctx_t)pcVar22)->ctx == N_DIV) {
        aVar27.u_val = vStack_188.u.u_val / uVar20;
      }
      break;
    }
    pVar41 = get_node_pos((c2m_ctx_t)pcVar18->node_positions,
                          (node_t_conflict)(ulong)*(uint *)((long)&((c2m_ctx_t)pcVar22)->ctx + 4));
    pcVar11 = "%";
    if (*(node_code_t *)&((c2m_ctx_t)pcVar22)->ctx == N_DIV) {
      pcVar11 = "/";
    }
    error(pcVar18,0x1c1611,pVar41.fname,pVar41._8_8_,pcVar11);
    aVar27.i_val = 1;
    break;
  case N_COND:
    vVar40 = eval(pcVar18,(node_t_conflict)((c2m_ctx_t)pcVar22)->env[0].__jmpbuf[2]);
    pnVar29 = (node_t_conflict)((c2m_ctx_t)pcVar22)->env[0].__jmpbuf[2];
    if (pnVar29 == (node_t_conflict)0x0) {
      pnVar29 = (node_t_conflict)0x0;
    }
    else {
      uVar10 = (uint)(vVar40.u.i_val == 0);
      do {
        pnVar29 = (pnVar29->op_link).next;
        bVar33 = uVar10 != 0;
        uVar10 = uVar10 - 1;
        if (pnVar29 == (node_t_conflict)0x0) break;
      } while (bVar33);
    }
LAB_001938c6:
    vVar40 = eval(pcVar18,pnVar29);
    pcVar32 = (char *)(ulong)(uint)vVar40.uns_p;
    aVar27.i_val = vVar40.u.i_val;
  }
  pVar42.lno = aVar27._0_4_;
  pVar42.ln_pos = aVar27._4_4_;
  pVar42.fname = pcVar32;
  return pVar42;
}

Assistant:

static pos_t check_line_directive_args (c2m_ctx_t c2m_ctx, VARR (token_t) * buffer) {
  size_t i, len = VARR_LENGTH (token_t, buffer);
  token_t *buffer_arr = VARR_ADDR (token_t, buffer);
  const char *fname;
  pos_t pos;
  int lno;
  unsigned long long l;

  if (len == 0) return no_pos;
  i = buffer_arr[0]->code == ' ' ? 1 : 0;
  fname = buffer_arr[i]->pos.fname;
  if (i >= len || buffer_arr[i]->code != T_NUMBER) return no_pos;
  if (!digits_p (buffer_arr[i]->repr)) return no_pos;
  errno = 0;
  l = strtoll (buffer_arr[i]->repr, NULL, 10);
  lno = (int) l;
  if (errno || l > ((1ul << 31) - 1))
    error (c2m_ctx, buffer_arr[i]->pos, "#line with too big value: %s", buffer_arr[i]->repr);
  i++;
  if (i < len && buffer_arr[i]->code == ' ') i++;
  if (i < len && buffer_arr[i]->code == T_STR) {
    fname = buffer_arr[i]->node->u.s.s;
    i++;
  }
  if (i == len) {
    pos.fname = fname;
    pos.lno = lno;
    pos.ln_pos = 0;
    return pos;
  }
  return no_pos;
}